

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::forward_int8_x86
          (ConvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  int *piVar2;
  _func_int **pp_Var3;
  void *pvVar4;
  void *pvVar5;
  Layer *pLVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  undefined1 uVar23;
  undefined1 auVar24 [32];
  int iVar25;
  long lVar26;
  undefined1 uVar27;
  uint uVar28;
  int iVar29;
  undefined4 *puVar30;
  ulong uVar31;
  long lVar32;
  int iVar33;
  int iVar34;
  float *pfVar35;
  uint _elempack;
  ulong uVar36;
  ulong uVar37;
  uint uVar38;
  int iVar39;
  int iVar40;
  _func_int *p_Var41;
  float fVar42;
  int iVar43;
  Option *_elemsize;
  Option *opt_00;
  long lVar44;
  int iVar45;
  int iVar46;
  undefined1 (*pauVar47) [16];
  undefined1 (*pauVar48) [16];
  ulong uVar49;
  bool bVar50;
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [64];
  float fVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar70;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar68;
  float fVar69;
  undefined1 auVar67 [64];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  float fVar97;
  undefined1 auVar78 [16];
  float fVar98;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  v4sf one;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [64];
  Option opt_q;
  float top_rescale;
  float scale_out;
  Mat m_1;
  Option opt_g;
  undefined1 local_308 [32];
  undefined1 local_2e8 [32];
  size_t local_2c8;
  float *local_2b8;
  ulong local_2b0;
  float *local_2a8;
  _func_int **local_2a0;
  ulong local_298;
  ulong local_290;
  Mat local_288;
  undefined1 local_238 [40];
  undefined1 auStack_210 [16];
  ulong uStack_200;
  size_t local_1f8;
  long local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  _func_int **local_1d0;
  undefined1 local_1c8 [56];
  int local_190;
  size_t local_188;
  undefined8 local_178;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  Allocator *local_168;
  int local_160;
  Allocator *local_158;
  undefined1 local_150 [16];
  undefined4 local_140;
  ulong local_138;
  void *local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  Allocator *local_118;
  int local_110;
  Allocator *local_108;
  undefined1 local_100 [16];
  int local_f0;
  ulong local_e8;
  long local_e0;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined4 uVar9;
  undefined3 uVar11;
  undefined2 uVar13;
  undefined4 uVar18;
  undefined3 uVar20;
  undefined2 uVar22;
  
  local_1c8._24_4_ = bottom_blob->elempack;
  local_190 = bottom_blob->c;
  if (local_1c8._24_4_ == 0) {
    bVar50 = false;
  }
  else {
    bVar50 = ((int)bottom_blob->elemsize << 3) / (int)local_1c8._24_4_ == 8;
  }
  p_Var41 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  iVar34 = *(int *)(&this->field_0xd4 + (long)p_Var41);
  iVar45 = *(int *)(&this->field_0xd8 + (long)p_Var41);
  iVar39 = *(int *)(&this->field_0xdc + (long)p_Var41);
  iVar46 = *(int *)(&this->field_0xe0 + (long)p_Var41);
  piVar2 = bottom_blob->refcount;
  local_1c8._0_8_ = bottom_blob->data;
  local_1c8._8_4_ = SUB84(bottom_blob->refcount,0);
  local_1c8._12_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_1c8._16_8_ = bottom_blob->elemsize;
  local_1c8._32_8_ = bottom_blob->allocator;
  local_1c8._40_4_ = bottom_blob->dims;
  local_1c8._44_4_ = bottom_blob->w;
  local_1c8._48_4_ = bottom_blob->h;
  local_1c8._52_4_ = bottom_blob->d;
  local_188 = bottom_blob->cstep;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  if (!bVar50) {
    uVar36 = (long)(local_1c8._24_4_ * local_190) /
             (long)*(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3])
    ;
    local_288.cstep = 0;
    local_288.data = (undefined4 *)0x0;
    local_288.refcount._0_4_ = 0;
    local_288.refcount._4_4_ = 0;
    local_288.elemsize = 0;
    local_288.elempack = 0;
    local_288.allocator = (Allocator *)0x0;
    local_288.dims = 0;
    local_288.w = 0;
    local_288.h = 0;
    local_288.d = 0;
    local_288.c = 0;
    Mat::create(&local_288,local_1c8._24_4_ * local_190,4,(Allocator *)0x0);
    pp_Var3 = this->_vptr_ConvolutionDepthWise_x86_avx;
    p_Var41 = pp_Var3[-3];
    if (0 < *(int *)(&this->field_0x108 + (long)p_Var41)) {
      lVar32 = 0;
      puVar30 = (undefined4 *)local_288.data;
      do {
        if (0 < (int)uVar36) {
          uVar1 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)p_Var41) + lVar32 * 4);
          uVar37 = uVar36 & 0xffffffff;
          do {
            *puVar30 = uVar1;
            puVar30 = puVar30 + 1;
            uVar38 = (int)uVar37 - 1;
            uVar37 = (ulong)uVar38;
          } while (uVar38 != 0);
        }
        lVar32 = lVar32 + 1;
        p_Var41 = pp_Var3[-3];
      } while (lVar32 < *(int *)(&this->field_0x108 + (long)p_Var41));
    }
    local_308._0_8_ = *(undefined8 *)opt;
    local_308._16_8_ = opt->workspace_allocator;
    uVar7 = opt->openmp_blocktime;
    uVar8 = opt->use_winograd_convolution;
    uVar10 = opt->use_sgemm_convolution;
    uVar12 = opt->use_int8_inference;
    uVar14 = opt->use_vulkan_compute;
    uVar13 = CONCAT11(uVar14,uVar12);
    uVar11 = CONCAT21(uVar13,uVar10);
    uVar9 = CONCAT31(uVar11,uVar8);
    local_2e8[0] = opt->use_bf16_storage;
    local_2e8[1] = opt->use_fp16_packed;
    local_2e8[2] = opt->use_fp16_storage;
    local_2e8[3] = opt->use_fp16_arithmetic;
    local_2e8[4] = opt->use_int8_packed;
    local_2e8[5] = opt->use_int8_storage;
    local_2e8[6] = opt->use_int8_arithmetic;
    local_2e8[7] = opt->use_packing_layout;
    local_2e8[8] = opt->use_shader_pack8;
    local_2e8[9] = opt->use_subgroup_basic;
    local_2e8[10] = opt->use_subgroup_vote;
    local_2e8[0xb] = opt->use_subgroup_ballot;
    local_2e8[0xc] = opt->use_subgroup_shuffle;
    local_2e8[0xd] = opt->use_image_storage;
    local_2e8[0xe] = opt->use_tensor_storage;
    local_2e8[0xf] = opt->use_reserved_0;
    local_2e8._16_4_ = opt->flush_denormals;
    local_2e8[0x14] = opt->use_local_pool_allocator;
    local_2e8[0x15] = opt->use_shader_local_memory;
    local_2e8[0x16] = opt->use_cooperative_matrix;
    local_2e8[0x17] = opt->use_winograd23_convolution;
    local_2e8[0x18] = opt->use_winograd43_convolution;
    local_2e8[0x19] = opt->use_winograd63_convolution;
    local_2e8[0x1a] = opt->use_a53_a55_optimized_kernel;
    local_2e8[0x1b] = opt->use_reserved_7;
    local_2e8[0x1c] = opt->use_reserved_8;
    local_2e8[0x1d] = opt->use_reserved_9;
    local_2e8[0x1e] = opt->use_reserved_10;
    local_2e8[0x1f] = opt->use_reserved_11;
    local_308._8_4_ = SUB84(opt->workspace_allocator,0);
    local_308._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_308._24_4_ = uVar7;
    local_308._28_4_ = uVar9;
    quantize_to_int8(bottom_blob,(Mat *)local_1c8,&local_288,(Option *)local_308);
    piVar2 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (local_288.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_288.data != (undefined4 *)0x0) {
            free(local_288.data);
          }
        }
        else {
          (*(local_288.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  local_288.cstep = 0;
  local_288.data = (pointer)0x0;
  local_288.refcount._0_4_ = 0;
  local_288.refcount._4_4_ = 0;
  local_288.elemsize = 0;
  local_288.elempack = 0;
  local_288.allocator = (Allocator *)0x0;
  local_288.dims = 0;
  local_288.w = 0;
  local_288.h = 0;
  local_288.d = 0;
  local_288.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx +
             (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]),(Mat *)local_1c8,&local_288,opt);
  iVar29 = local_288.c;
  iVar25 = local_288.w;
  iVar33 = local_288.elempack;
  iVar40 = -100;
  local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_);
  if (((pointer)local_288.data == (pointer)0x0) ||
     (local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_),
     (long)local_288.c * local_288.cstep == 0)) goto LAB_004163e2;
  uVar37 = (ulong)(uint)local_288.c;
  p_Var41 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  iVar34 = (~((iVar34 + -1) * iVar39) + local_288.w) / *(int *)(&this->field_0xe4 + (long)p_Var41);
  iVar39 = iVar34 + 1;
  uVar36 = (long)(~((iVar45 + -1) * iVar46) + local_288.h) /
           (long)*(int *)(&this->field_0xe8 + (long)p_Var41);
  local_1d8 = uVar36 & 0xffffffff;
  iVar45 = (int)uVar36 + 1;
  uVar38 = local_288.c * local_288.elempack;
  if ((uVar38 == *(uint *)(&this->field_0x108 + (long)p_Var41)) &&
     (uVar28 = *(uint *)(&this->field_0xd0 + (long)p_Var41),
     *(uint *)(&this->field_0x108 + (long)p_Var41) == uVar28)) {
    uVar38 = 8;
    if (opt->use_packing_layout == false) {
      uVar38 = 1;
    }
    if ((uVar28 & 7) != 0) {
      uVar38 = 1;
    }
    opt_00 = (Option *)(ulong)uVar38;
    iVar46 = *(int *)(&this->field_0x10c + (long)p_Var41);
    _elemsize = (Option *)(ulong)(uVar38 * 4);
    if (100 < iVar46) {
      _elemsize = opt_00;
    }
    Mat::create(top_blob,iVar39,iVar45,(int)uVar28 / (int)uVar38,(size_t)_elemsize,uVar38,
                opt->blob_allocator);
    iVar40 = -100;
    local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_);
    if ((top_blob->data == (void *)0x0) ||
       (local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_),
       (long)top_blob->c * top_blob->cstep == 0)) goto LAB_004163e2;
    iVar40 = 0;
    if (iVar33 != 1) {
      local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_);
      if (iVar33 == 8) {
        uVar36 = (long)*(int *)(&this->field_0xd8 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) *
                 (long)*(int *)(&this->field_0xd4 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_308,uVar36,(allocator_type *)local_238
                  );
        pp_Var3 = this->_vptr_ConvolutionDepthWise_x86_avx;
        p_Var41 = pp_Var3[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var41)) {
          iVar45 = *(int *)(&this->field_0xe0 + (long)p_Var41);
          iVar39 = *(int *)(&this->field_0xdc + (long)p_Var41);
          iVar33 = *(int *)(&this->field_0xd4 + (long)p_Var41);
          iVar40 = 0;
          fVar42 = 0.0;
          iVar43 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var3[-3])) {
              lVar32 = 0;
              do {
                *(float *)(local_308._0_8_ + (iVar40 + lVar32) * 4) = fVar42;
                fVar42 = (float)((int)fVar42 + *(int *)(&this->field_0xdc + (long)pp_Var3[-3]));
                lVar32 = lVar32 + 1;
              } while ((int)lVar32 < *(int *)(&this->field_0xd4 + (long)pp_Var3[-3]));
              iVar40 = iVar40 + (int)lVar32;
            }
            fVar42 = (float)((int)fVar42 + (iVar45 * iVar25 - iVar39 * iVar33));
            iVar43 = iVar43 + 1;
          } while (iVar43 < *(int *)(&this->field_0xd8 + (long)pp_Var3[-3]));
        }
        local_1d0 = (_func_int **)CONCAT44(local_1d0._4_4_,iVar25);
        if (0 < iVar29) {
          iVar45 = (int)uVar36 * 8;
          local_1e8 = CONCAT44(local_1e8._4_4_,iVar45);
          local_290 = 0;
          auVar141 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
          auVar59 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
          auVar138 = ZEXT1664(CONCAT412(0x42b0c0a5,CONCAT48(0x42b0c0a5,0x42b0c0a542b0c0a5)));
          auVar51._8_4_ = 0x3f800000;
          auVar51._0_8_ = 0x3f8000003f800000;
          auVar51._12_4_ = 0x3f800000;
          local_298 = 0;
          do {
            if (-1 < (int)local_1d8) {
              local_2a0 = (_func_int **)
                          (local_288.cstep * local_298 * local_288.elemsize + (long)local_288.data);
              pauVar47 = (undefined1 (*) [16])
                         (top_blob->elemsize * local_298 * top_blob->cstep + (long)top_blob->data);
              pp_Var3 = this->_vptr_ConvolutionDepthWise_x86_avx;
              local_2a8 = (float *)((long)local_288.w * local_288.elemsize);
              pvVar4 = (this->weight_data_tm).data;
              local_2b0 = 0;
              pauVar48 = pauVar47;
              do {
                if (-1 < iVar34) {
                  local_2b8 = (float *)(long)(int)local_2b0;
                  iVar39 = 0;
                  do {
                    p_Var41 = pp_Var3[-3];
                    if ((int)uVar36 < 1) {
                      auVar104 = ZEXT816(0) << 0x40;
                      auVar103 = ZEXT816(0) << 0x40;
                    }
                    else {
                      auVar67 = ZEXT1664((undefined1  [16])0x0);
                      uVar49 = 0;
                      auVar77 = ZEXT1664((undefined1  [16])0x0);
                      do {
                        auVar104._8_8_ = 0;
                        auVar104._0_8_ =
                             *(ulong *)((long)local_2a0 +
                                       (long)(int)*(pointer)(local_308._0_8_ + uVar49 * 4) * 8 +
                                       (long)*(int *)(&this->field_0xe8 + (long)p_Var41) *
                                       (long)local_2b8 * (long)local_2a8 +
                                       (long)(*(int *)(&this->field_0xe4 + (long)p_Var41) * iVar39 *
                                             8));
                        auVar103 = vpcmpgtb_avx((undefined1  [16])0x0,auVar104);
                        auVar104 = vpunpcklbw_avx(auVar104,auVar103);
                        auVar99._8_8_ = 0;
                        auVar99._0_8_ = *(ulong *)((long)pvVar4 + uVar49 * 8 + (long)(int)local_290)
                        ;
                        auVar103 = vpcmpgtb_avx((undefined1  [16])0x0,auVar99);
                        auVar103 = vpunpcklbw_avx(auVar99,auVar103);
                        auVar99 = vpmullw_avx(auVar103,auVar104);
                        auVar104 = vpmulhw_avx(auVar104,auVar103);
                        auVar103 = vpunpcklwd_avx(auVar99,auVar104);
                        auVar103 = vpaddd_avx(auVar67._0_16_,auVar103);
                        auVar67 = ZEXT1664(auVar103);
                        auVar104 = vpunpckhwd_avx(auVar99,auVar104);
                        auVar104 = vpaddd_avx(auVar77._0_16_,auVar104);
                        auVar77 = ZEXT1664(auVar104);
                        uVar49 = uVar49 + 1;
                      } while ((uVar36 & 0xffffffff) != uVar49);
                      auVar103 = vcvtdq2ps_avx(auVar103);
                      auVar104 = vcvtdq2ps_avx(auVar104);
                    }
                    auVar99 = *(undefined1 (*) [16])
                               (*(long *)(&this->field_0x1f8 + (long)p_Var41) + local_298 * 0x20);
                    auVar71 = *(undefined1 (*) [16])
                               (*(long *)(&this->field_0x1f8 + (long)p_Var41) + 0x10 +
                               local_298 * 0x20);
                    pfVar35 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var41) +
                                       local_298 * 0x20);
                    auVar100._0_4_ = auVar99._0_4_ * *pfVar35;
                    auVar100._4_4_ = auVar99._4_4_ * pfVar35[1];
                    auVar100._8_4_ = auVar99._8_4_ * pfVar35[2];
                    auVar100._12_4_ = auVar99._12_4_ * pfVar35[3];
                    auVar61 = vrcpps_avx(auVar100);
                    pfVar35 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var41) + 0x10 +
                                       local_298 * 0x20);
                    auVar115._0_4_ = auVar71._0_4_ * *pfVar35;
                    auVar115._4_4_ = auVar71._4_4_ * pfVar35[1];
                    auVar115._8_4_ = auVar71._8_4_ * pfVar35[2];
                    auVar115._12_4_ = auVar71._12_4_ * pfVar35[3];
                    auVar100 = vrcpps_avx(auVar115);
                    auVar99 = vcmpps_avx(auVar99,(undefined1  [16])0x0,4);
                    auVar99 = vandps_avx(auVar99,auVar61);
                    auVar61._0_4_ = auVar99._0_4_ * auVar103._0_4_;
                    auVar61._4_4_ = auVar99._4_4_ * auVar103._4_4_;
                    auVar61._8_4_ = auVar99._8_4_ * auVar103._8_4_;
                    auVar61._12_4_ = auVar99._12_4_ * auVar103._12_4_;
                    auVar103 = vcmpps_avx(auVar71,(undefined1  [16])0x0,4);
                    auVar103 = vandps_avx(auVar103,auVar100);
                    auVar71._0_4_ = auVar103._0_4_ * auVar104._0_4_;
                    auVar71._4_4_ = auVar103._4_4_ * auVar104._4_4_;
                    auVar71._8_4_ = auVar103._8_4_ * auVar104._8_4_;
                    auVar71._12_4_ = auVar103._12_4_ * auVar104._12_4_;
                    if (*(int *)(&this->field_0x100 + (long)p_Var41) != 0) {
                      pfVar35 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var41) +
                                         local_298 * 0x20);
                      auVar61._0_4_ = auVar61._0_4_ + *pfVar35;
                      auVar61._4_4_ = auVar61._4_4_ + pfVar35[1];
                      auVar61._8_4_ = auVar61._8_4_ + pfVar35[2];
                      auVar61._12_4_ = auVar61._12_4_ + pfVar35[3];
                      pfVar35 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var41) + 0x10 +
                                         local_298 * 0x20);
                      auVar71._0_4_ = auVar71._0_4_ + *pfVar35;
                      auVar71._4_4_ = auVar71._4_4_ + pfVar35[1];
                      auVar71._8_4_ = auVar71._8_4_ + pfVar35[2];
                      auVar71._12_4_ = auVar71._12_4_ + pfVar35[3];
                    }
                    iVar33 = *(int *)(&this->field_0x110 + (long)p_Var41) + -1;
                    fVar42 = auVar59._0_4_;
                    fVar52 = auVar59._4_4_;
                    fVar97 = auVar59._8_4_;
                    fVar98 = auVar59._12_4_;
                    fVar60 = auVar61._0_4_;
                    fVar68 = auVar61._4_4_;
                    fVar69 = auVar61._8_4_;
                    fVar70 = auVar61._12_4_;
                    switch(iVar33) {
                    case 0:
                      auVar61 = vmaxps_avx(auVar61,(undefined1  [16])0x0);
                      break;
                    case 1:
                      auVar103 = vmaxps_avx(auVar61,(undefined1  [16])0x0);
                      auVar104 = vminps_avx(auVar61,(undefined1  [16])0x0);
                      fVar42 = **(float **)(&this->field_0x118 + (long)p_Var41);
                      auVar61._0_4_ = fVar42 * auVar104._0_4_ + auVar103._0_4_;
                      auVar61._4_4_ = fVar42 * auVar104._4_4_ + auVar103._4_4_;
                      auVar61._8_4_ = fVar42 * auVar104._8_4_ + auVar103._8_4_;
                      auVar61._12_4_ = fVar42 * auVar104._12_4_ + auVar103._12_4_;
                      break;
                    case 2:
                      uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var41);
                      auVar82._4_4_ = uVar1;
                      auVar82._0_4_ = uVar1;
                      auVar82._8_4_ = uVar1;
                      auVar82._12_4_ = uVar1;
                      uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var41))[1];
                      auVar107._4_4_ = uVar1;
                      auVar107._0_4_ = uVar1;
                      auVar107._8_4_ = uVar1;
                      auVar107._12_4_ = uVar1;
                      auVar103 = vmaxps_avx(auVar61,auVar82);
                      auVar61 = vminps_avx(auVar103,auVar107);
                      break;
                    case 3:
                      auVar62._0_4_ = auVar141._0_4_ ^ (uint)fVar60;
                      auVar62._4_4_ = auVar141._4_4_ ^ (uint)fVar68;
                      auVar62._8_4_ = auVar141._8_4_ ^ (uint)fVar69;
                      auVar62._12_4_ = auVar141._12_4_ ^ (uint)fVar70;
                      auVar103 = vminps_avx(auVar138._0_16_,auVar62);
                      auVar83._8_4_ = 0xc2b0c0a5;
                      auVar83._0_8_ = 0xc2b0c0a5c2b0c0a5;
                      auVar83._12_4_ = 0xc2b0c0a5;
                      auVar99 = vmaxps_avx(auVar103,auVar83);
                      auVar84._0_4_ = auVar99._0_4_ * 1.442695 + fVar42;
                      auVar84._4_4_ = auVar99._4_4_ * 1.442695 + fVar52;
                      auVar84._8_4_ = auVar99._8_4_ * 1.442695 + fVar97;
                      auVar84._12_4_ = auVar99._12_4_ * 1.442695 + fVar98;
                      auVar108._0_4_ = (int)auVar84._0_4_;
                      auVar108._4_4_ = (int)auVar84._4_4_;
                      auVar108._8_4_ = (int)auVar84._8_4_;
                      auVar108._12_4_ = (int)auVar84._12_4_;
                      auVar104 = vcvtdq2ps_avx(auVar108);
                      auVar103 = vcmpps_avx(auVar84,auVar104,1);
                      auVar103 = vandps_avx(auVar51,auVar103);
                      auVar103 = vsubps_avx(auVar104,auVar103);
                      fVar60 = auVar99._0_4_ + auVar103._0_4_ * -0.6931472;
                      fVar68 = auVar99._4_4_ + auVar103._4_4_ * -0.6931472;
                      fVar69 = auVar99._8_4_ + auVar103._8_4_ * -0.6931472;
                      fVar70 = auVar99._12_4_ + auVar103._12_4_ * -0.6931472;
                      auVar85._0_4_ = (int)auVar103._0_4_;
                      auVar85._4_4_ = (int)auVar103._4_4_;
                      auVar85._8_4_ = (int)auVar103._8_4_;
                      auVar85._12_4_ = (int)auVar103._12_4_;
                      auVar103 = vpslld_avx(auVar85,0x17);
                      auVar103 = vpaddd_avx(auVar51,auVar103);
                      auVar63._0_4_ =
                           (fVar60 + 1.0 +
                           fVar60 * fVar60 *
                           (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) *
                              fVar60 + 0.041665796) * fVar60 + 0.16666666) * fVar60 + fVar42)) *
                           auVar103._0_4_ + 1.0;
                      auVar63._4_4_ =
                           (fVar68 + 1.0 +
                           fVar68 * fVar68 *
                           (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) *
                              fVar68 + 0.041665796) * fVar68 + 0.16666666) * fVar68 + fVar52)) *
                           auVar103._4_4_ + 1.0;
                      auVar63._8_4_ =
                           (fVar69 + 1.0 +
                           fVar69 * fVar69 *
                           (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) *
                              fVar69 + 0.041665796) * fVar69 + 0.16666666) * fVar69 + fVar97)) *
                           auVar103._8_4_ + 1.0;
                      auVar63._12_4_ =
                           (fVar70 + 1.0 +
                           fVar70 * fVar70 *
                           (((((fVar70 * 0.00019875691 + 0.0013981999) * fVar70 + 0.008333452) *
                              fVar70 + 0.041665796) * fVar70 + 0.16666666) * fVar70 + fVar98)) *
                           auVar103._12_4_ + 1.0;
                      auVar103 = vrcpps_avx(auVar63);
                      fVar42 = auVar103._0_4_;
                      auVar64._0_4_ = auVar63._0_4_ * fVar42;
                      fVar52 = auVar103._4_4_;
                      auVar64._4_4_ = auVar63._4_4_ * fVar52;
                      fVar97 = auVar103._8_4_;
                      auVar64._8_4_ = auVar63._8_4_ * fVar97;
                      fVar98 = auVar103._12_4_;
                      auVar64._12_4_ = auVar63._12_4_ * fVar98;
                      auVar103 = vsubps_avx(auVar51,auVar64);
                      auVar61._0_4_ = fVar42 + fVar42 * auVar103._0_4_;
                      auVar61._4_4_ = fVar52 + fVar52 * auVar103._4_4_;
                      auVar61._8_4_ = fVar97 + fVar97 * auVar103._8_4_;
                      auVar61._12_4_ = fVar98 + fVar98 * auVar103._12_4_;
                      break;
                    case 4:
                      auVar103 = vminps_avx(auVar138._0_16_,auVar61);
                      auVar139._8_4_ = 0xc2b0c0a5;
                      auVar139._0_8_ = 0xc2b0c0a5c2b0c0a5;
                      auVar139._12_4_ = 0xc2b0c0a5;
                      auVar99 = vmaxps_avx(auVar139,auVar103);
                      auVar101._0_4_ = auVar99._0_4_ * 1.442695 + fVar42;
                      auVar101._4_4_ = auVar99._4_4_ * 1.442695 + fVar52;
                      auVar101._8_4_ = auVar99._8_4_ * 1.442695 + fVar97;
                      auVar101._12_4_ = auVar99._12_4_ * 1.442695 + fVar98;
                      auVar116._0_4_ = (int)auVar101._0_4_;
                      auVar116._4_4_ = (int)auVar101._4_4_;
                      auVar116._8_4_ = (int)auVar101._8_4_;
                      auVar116._12_4_ = (int)auVar101._12_4_;
                      auVar104 = vcvtdq2ps_avx(auVar116);
                      auVar103 = vcmpps_avx(auVar101,auVar104,1);
                      auVar103 = vandps_avx(auVar51,auVar103);
                      auVar103 = vsubps_avx(auVar104,auVar103);
                      auVar117._0_4_ = auVar103._0_4_ * 0.6931472;
                      auVar117._4_4_ = auVar103._4_4_ * 0.6931472;
                      auVar117._8_4_ = auVar103._8_4_ * 0.6931472;
                      auVar117._12_4_ = auVar103._12_4_ * 0.6931472;
                      auVar104 = vsubps_avx(auVar99,auVar117);
                      fVar42 = auVar104._0_4_;
                      fVar52 = auVar104._4_4_;
                      fVar97 = auVar104._8_4_;
                      fVar98 = auVar104._12_4_;
                      auVar102._0_4_ = (int)auVar103._0_4_;
                      auVar102._4_4_ = (int)auVar103._4_4_;
                      auVar102._8_4_ = (int)auVar103._8_4_;
                      auVar102._12_4_ = (int)auVar103._12_4_;
                      auVar103 = vpslld_avx(auVar102,0x17);
                      auVar103 = vpaddd_avx(auVar51,auVar103);
                      auVar132._0_4_ =
                           (fVar42 + 1.0 +
                           (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) *
                              fVar42 + 0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5) *
                           fVar42 * fVar42) * auVar103._0_4_ + 1.0;
                      auVar132._4_4_ =
                           (fVar52 + 1.0 +
                           (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) *
                              fVar52 + 0.041665796) * fVar52 + 0.16666666) * fVar52 + 0.5) *
                           fVar52 * fVar52) * auVar103._4_4_ + 1.0;
                      auVar132._8_4_ =
                           (fVar97 + 1.0 +
                           (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) *
                              fVar97 + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) *
                           fVar97 * fVar97) * auVar103._8_4_ + 1.0;
                      auVar132._12_4_ =
                           (fVar98 + 1.0 +
                           (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) *
                              fVar98 + 0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5) *
                           fVar98 * fVar98) * auVar103._12_4_ + 1.0;
                      auVar78._8_4_ = 0x800000;
                      auVar78._0_8_ = 0x80000000800000;
                      auVar78._12_4_ = 0x800000;
                      auVar103 = vmaxps_avx(auVar132,auVar78);
                      auVar104 = vpsrld_avx(auVar103,0x17);
                      auVar118._8_4_ = 0x807fffff;
                      auVar118._0_8_ = 0x807fffff807fffff;
                      auVar118._12_4_ = 0x807fffff;
                      auVar103 = vandps_avx(auVar103,auVar118);
                      auVar119._8_4_ = 0x3f000000;
                      auVar119._0_8_ = 0x3f0000003f000000;
                      auVar119._12_4_ = 0x3f000000;
                      auVar61 = vorps_avx(auVar103,auVar119);
                      auVar120._8_4_ = 0xffffff82;
                      auVar120._0_8_ = 0xffffff82ffffff82;
                      auVar120._12_4_ = 0xffffff82;
                      auVar103 = vpaddd_avx(auVar104,auVar120);
                      auVar99 = vcvtdq2ps_avx(auVar103);
                      auVar121._8_4_ = 0x3f3504f3;
                      auVar121._0_8_ = 0x3f3504f33f3504f3;
                      auVar121._12_4_ = 0x3f3504f3;
                      auVar104 = vcmpps_avx(auVar61,auVar121,1);
                      auVar103 = vandps_avx(auVar104,auVar61);
                      fVar42 = auVar103._0_4_ + auVar61._0_4_ + -1.0;
                      fVar52 = auVar103._4_4_ + auVar61._4_4_ + -1.0;
                      fVar97 = auVar103._8_4_ + auVar61._8_4_ + -1.0;
                      fVar98 = auVar103._12_4_ + auVar61._12_4_ + -1.0;
                      auVar103 = vandps_avx(auVar51,auVar104);
                      auVar104 = vsubps_avx(auVar99,auVar103);
                      auVar136._8_4_ = 0x42b0c0a5;
                      auVar136._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar136._12_4_ = 0x42b0c0a5;
                      auVar138 = ZEXT1664(auVar136);
                      auVar103 = vcmpps_avx(auVar132,(undefined1  [16])0x0,2);
                      auVar79._0_4_ =
                           (auVar104._0_4_ * 0.6931472 + fVar42 +
                           (((((((((fVar42 * 0.070376836 + -0.1151461) * fVar42 + 0.116769984) *
                                  fVar42 + -0.12420141) * fVar42 + 0.14249323) * fVar42 +
                               -0.16668057) * fVar42 + 0.20000714) * fVar42 + -0.24999994) * fVar42
                            + 0.3333333) * fVar42 + -0.5) * fVar42 * fVar42) * -2.0;
                      auVar79._4_4_ =
                           (auVar104._4_4_ * 0.6931472 + fVar52 +
                           (((((((((fVar52 * 0.070376836 + -0.1151461) * fVar52 + 0.116769984) *
                                  fVar52 + -0.12420141) * fVar52 + 0.14249323) * fVar52 +
                               -0.16668057) * fVar52 + 0.20000714) * fVar52 + -0.24999994) * fVar52
                            + 0.3333333) * fVar52 + -0.5) * fVar52 * fVar52) * -2.0;
                      auVar79._8_4_ =
                           (auVar104._8_4_ * 0.6931472 + fVar97 +
                           (((((((((fVar97 * 0.070376836 + -0.1151461) * fVar97 + 0.116769984) *
                                  fVar97 + -0.12420141) * fVar97 + 0.14249323) * fVar97 +
                               -0.16668057) * fVar97 + 0.20000714) * fVar97 + -0.24999994) * fVar97
                            + 0.3333333) * fVar97 + -0.5) * fVar97 * fVar97) * -2.0;
                      auVar79._12_4_ =
                           (auVar104._12_4_ * 0.6931472 + fVar98 +
                           (((((((((fVar98 * 0.070376836 + -0.1151461) * fVar98 + 0.116769984) *
                                  fVar98 + -0.12420141) * fVar98 + 0.14249323) * fVar98 +
                               -0.16668057) * fVar98 + 0.20000714) * fVar98 + -0.24999994) * fVar98
                            + 0.3333333) * fVar98 + -0.5) * fVar98 * fVar98) * -2.0;
                      auVar54._8_4_ = 0x7fffffff;
                      auVar54._0_8_ = 0x7fffffff7fffffff;
                      auVar54._12_4_ = 0x7fffffff;
                      auVar103 = vblendvps_avx(auVar79,auVar54,auVar103);
                      auVar103 = vminps_avx(auVar136,auVar103);
                      auVar99 = vmaxps_avx(auVar139,auVar103);
                      auVar141 = ZEXT1664(CONCAT412(0x80000000,
                                                    CONCAT48(0x80000000,0x8000000080000000)));
                      auVar105._0_4_ = auVar99._0_4_ * 1.442695 + 0.5;
                      auVar105._4_4_ = auVar99._4_4_ * 1.442695 + 0.5;
                      auVar105._8_4_ = auVar99._8_4_ * 1.442695 + 0.5;
                      auVar105._12_4_ = auVar99._12_4_ * 1.442695 + 0.5;
                      auVar122._0_4_ = (int)auVar105._0_4_;
                      auVar122._4_4_ = (int)auVar105._4_4_;
                      auVar122._8_4_ = (int)auVar105._8_4_;
                      auVar122._12_4_ = (int)auVar105._12_4_;
                      auVar104 = vcvtdq2ps_avx(auVar122);
                      auVar103 = vcmpps_avx(auVar105,auVar104,1);
                      auVar103 = vandps_avx(auVar51,auVar103);
                      auVar103 = vsubps_avx(auVar104,auVar103);
                      auVar123._0_4_ = auVar103._0_4_ * 0.6931472;
                      auVar123._4_4_ = auVar103._4_4_ * 0.6931472;
                      auVar123._8_4_ = auVar103._8_4_ * 0.6931472;
                      auVar123._12_4_ = auVar103._12_4_ * 0.6931472;
                      auVar104 = vsubps_avx(auVar99,auVar123);
                      fVar42 = auVar104._0_4_;
                      fVar52 = auVar104._4_4_;
                      fVar97 = auVar104._8_4_;
                      fVar98 = auVar104._12_4_;
                      auVar59 = ZEXT1664(CONCAT412(0x3f000000,
                                                   CONCAT48(0x3f000000,0x3f0000003f000000)));
                      auVar106._0_4_ = (int)auVar103._0_4_;
                      auVar106._4_4_ = (int)auVar103._4_4_;
                      auVar106._8_4_ = (int)auVar103._8_4_;
                      auVar106._12_4_ = (int)auVar103._12_4_;
                      auVar103 = vpslld_avx(auVar106,0x17);
                      auVar103 = vpaddd_avx(auVar51,auVar103);
                      auVar80._0_4_ =
                           (fVar42 + 1.0 +
                           (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) *
                              fVar42 + 0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5) *
                           fVar42 * fVar42) * auVar103._0_4_ + 1.0;
                      auVar80._4_4_ =
                           (fVar52 + 1.0 +
                           (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) *
                              fVar52 + 0.041665796) * fVar52 + 0.16666666) * fVar52 + 0.5) *
                           fVar52 * fVar52) * auVar103._4_4_ + 1.0;
                      auVar80._8_4_ =
                           (fVar97 + 1.0 +
                           (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) *
                              fVar97 + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) *
                           fVar97 * fVar97) * auVar103._8_4_ + 1.0;
                      auVar80._12_4_ =
                           (fVar98 + 1.0 +
                           (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) *
                              fVar98 + 0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5) *
                           fVar98 * fVar98) * auVar103._12_4_ + 1.0;
                      auVar103 = vrcpps_avx(auVar80);
                      fVar42 = auVar103._0_4_;
                      fVar52 = auVar103._4_4_;
                      fVar97 = auVar103._8_4_;
                      fVar98 = auVar103._12_4_;
                      auVar81._0_4_ = auVar80._0_4_ * (fVar42 + fVar42);
                      auVar81._4_4_ = auVar80._4_4_ * (fVar52 + fVar52);
                      auVar81._8_4_ = auVar80._8_4_ * (fVar97 + fVar97);
                      auVar81._12_4_ = auVar80._12_4_ * (fVar98 + fVar98);
                      auVar133._8_4_ = 0x40000000;
                      auVar133._0_8_ = 0x4000000040000000;
                      auVar133._12_4_ = 0x40000000;
                      auVar104 = vsubps_avx(auVar133,auVar81);
                      auVar103._0_4_ = fVar42 + fVar42 + -1.0 + fVar42 * auVar104._0_4_;
                      auVar103._4_4_ = fVar52 + fVar52 + -1.0 + fVar52 * auVar104._4_4_;
                      auVar103._8_4_ = fVar97 + fVar97 + -1.0 + fVar97 * auVar104._8_4_;
                      auVar103._12_4_ = fVar98 + fVar98 + -1.0 + fVar98 * auVar104._12_4_;
                      goto LAB_00414da1;
                    case 5:
                      fVar42 = **(float **)(&this->field_0x118 + (long)p_Var41);
                      fVar52 = (*(float **)(&this->field_0x118 + (long)p_Var41))[1];
                      auVar86._0_4_ = fVar42 * fVar60 + fVar52;
                      auVar86._4_4_ = fVar42 * fVar68 + fVar52;
                      auVar86._8_4_ = fVar42 * fVar69 + fVar52;
                      auVar86._12_4_ = fVar42 * fVar70 + fVar52;
                      auVar103 = vmaxps_avx(auVar86,(undefined1  [16])0x0);
                      auVar103 = vminps_avx(auVar51,auVar103);
LAB_00414da1:
                      auVar61._0_4_ = auVar103._0_4_ * fVar60;
                      auVar61._4_4_ = auVar103._4_4_ * fVar68;
                      auVar61._8_4_ = auVar103._8_4_ * fVar69;
                      auVar61._12_4_ = auVar103._12_4_ * fVar70;
                    }
                    fVar42 = auVar59._0_4_;
                    fVar52 = auVar59._4_4_;
                    fVar97 = auVar59._8_4_;
                    fVar98 = auVar59._12_4_;
                    fVar60 = auVar71._0_4_;
                    fVar68 = auVar71._4_4_;
                    fVar69 = auVar71._8_4_;
                    fVar70 = auVar71._12_4_;
                    switch(iVar33) {
                    case 0:
                      auVar71 = vmaxps_avx(auVar71,(undefined1  [16])0x0);
                      break;
                    case 1:
                      auVar103 = vmaxps_avx(auVar71,(undefined1  [16])0x0);
                      auVar104 = vminps_avx(auVar71,(undefined1  [16])0x0);
                      fVar42 = **(float **)(&this->field_0x118 + (long)p_Var41);
                      auVar71._0_4_ = fVar42 * auVar104._0_4_ + auVar103._0_4_;
                      auVar71._4_4_ = fVar42 * auVar104._4_4_ + auVar103._4_4_;
                      auVar71._8_4_ = fVar42 * auVar104._8_4_ + auVar103._8_4_;
                      auVar71._12_4_ = fVar42 * auVar104._12_4_ + auVar103._12_4_;
                      break;
                    case 2:
                      uVar1 = **(undefined4 **)(&this->field_0x118 + (long)p_Var41);
                      auVar92._4_4_ = uVar1;
                      auVar92._0_4_ = uVar1;
                      auVar92._8_4_ = uVar1;
                      auVar92._12_4_ = uVar1;
                      uVar1 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var41))[1];
                      auVar113._4_4_ = uVar1;
                      auVar113._0_4_ = uVar1;
                      auVar113._8_4_ = uVar1;
                      auVar113._12_4_ = uVar1;
                      auVar103 = vmaxps_avx(auVar71,auVar92);
                      auVar71 = vminps_avx(auVar103,auVar113);
                      break;
                    case 3:
                      auVar72._0_4_ = auVar141._0_4_ ^ (uint)fVar60;
                      auVar72._4_4_ = auVar141._4_4_ ^ (uint)fVar68;
                      auVar72._8_4_ = auVar141._8_4_ ^ (uint)fVar69;
                      auVar72._12_4_ = auVar141._12_4_ ^ (uint)fVar70;
                      auVar103 = vminps_avx(auVar138._0_16_,auVar72);
                      auVar93._8_4_ = 0xc2b0c0a5;
                      auVar93._0_8_ = 0xc2b0c0a5c2b0c0a5;
                      auVar93._12_4_ = 0xc2b0c0a5;
                      auVar99 = vmaxps_avx(auVar103,auVar93);
                      auVar94._0_4_ = auVar99._0_4_ * 1.442695 + fVar42;
                      auVar94._4_4_ = auVar99._4_4_ * 1.442695 + fVar52;
                      auVar94._8_4_ = auVar99._8_4_ * 1.442695 + fVar97;
                      auVar94._12_4_ = auVar99._12_4_ * 1.442695 + fVar98;
                      auVar114._0_4_ = (int)auVar94._0_4_;
                      auVar114._4_4_ = (int)auVar94._4_4_;
                      auVar114._8_4_ = (int)auVar94._8_4_;
                      auVar114._12_4_ = (int)auVar94._12_4_;
                      auVar104 = vcvtdq2ps_avx(auVar114);
                      auVar103 = vcmpps_avx(auVar94,auVar104,1);
                      auVar103 = vandps_avx(auVar51,auVar103);
                      auVar103 = vsubps_avx(auVar104,auVar103);
                      fVar60 = auVar99._0_4_ + auVar103._0_4_ * -0.6931472;
                      fVar68 = auVar99._4_4_ + auVar103._4_4_ * -0.6931472;
                      fVar69 = auVar99._8_4_ + auVar103._8_4_ * -0.6931472;
                      fVar70 = auVar99._12_4_ + auVar103._12_4_ * -0.6931472;
                      auVar95._0_4_ = (int)auVar103._0_4_;
                      auVar95._4_4_ = (int)auVar103._4_4_;
                      auVar95._8_4_ = (int)auVar103._8_4_;
                      auVar95._12_4_ = (int)auVar103._12_4_;
                      auVar103 = vpslld_avx(auVar95,0x17);
                      auVar103 = vpaddd_avx(auVar51,auVar103);
                      auVar73._0_4_ =
                           (fVar60 + 1.0 +
                           fVar60 * fVar60 *
                           (((((fVar60 * 0.00019875691 + 0.0013981999) * fVar60 + 0.008333452) *
                              fVar60 + 0.041665796) * fVar60 + 0.16666666) * fVar60 + fVar42)) *
                           auVar103._0_4_ + 1.0;
                      auVar73._4_4_ =
                           (fVar68 + 1.0 +
                           fVar68 * fVar68 *
                           (((((fVar68 * 0.00019875691 + 0.0013981999) * fVar68 + 0.008333452) *
                              fVar68 + 0.041665796) * fVar68 + 0.16666666) * fVar68 + fVar52)) *
                           auVar103._4_4_ + 1.0;
                      auVar73._8_4_ =
                           (fVar69 + 1.0 +
                           fVar69 * fVar69 *
                           (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) *
                              fVar69 + 0.041665796) * fVar69 + 0.16666666) * fVar69 + fVar97)) *
                           auVar103._8_4_ + 1.0;
                      auVar73._12_4_ =
                           (fVar70 + 1.0 +
                           fVar70 * fVar70 *
                           (((((fVar70 * 0.00019875691 + 0.0013981999) * fVar70 + 0.008333452) *
                              fVar70 + 0.041665796) * fVar70 + 0.16666666) * fVar70 + fVar98)) *
                           auVar103._12_4_ + 1.0;
                      auVar103 = vrcpps_avx(auVar73);
                      fVar42 = auVar103._0_4_;
                      auVar74._0_4_ = auVar73._0_4_ * fVar42;
                      fVar52 = auVar103._4_4_;
                      auVar74._4_4_ = auVar73._4_4_ * fVar52;
                      fVar97 = auVar103._8_4_;
                      auVar74._8_4_ = auVar73._8_4_ * fVar97;
                      fVar98 = auVar103._12_4_;
                      auVar74._12_4_ = auVar73._12_4_ * fVar98;
                      auVar103 = vsubps_avx(auVar51,auVar74);
                      auVar71._0_4_ = fVar42 + fVar42 * auVar103._0_4_;
                      auVar71._4_4_ = fVar52 + fVar52 * auVar103._4_4_;
                      auVar71._8_4_ = fVar97 + fVar97 * auVar103._8_4_;
                      auVar71._12_4_ = fVar98 + fVar98 * auVar103._12_4_;
                      break;
                    case 4:
                      auVar103 = vminps_avx(auVar138._0_16_,auVar71);
                      auVar140._8_4_ = 0xc2b0c0a5;
                      auVar140._0_8_ = 0xc2b0c0a5c2b0c0a5;
                      auVar140._12_4_ = 0xc2b0c0a5;
                      auVar99 = vmaxps_avx(auVar140,auVar103);
                      auVar109._0_4_ = auVar99._0_4_ * 1.442695 + fVar42;
                      auVar109._4_4_ = auVar99._4_4_ * 1.442695 + fVar52;
                      auVar109._8_4_ = auVar99._8_4_ * 1.442695 + fVar97;
                      auVar109._12_4_ = auVar99._12_4_ * 1.442695 + fVar98;
                      auVar124._0_4_ = (int)auVar109._0_4_;
                      auVar124._4_4_ = (int)auVar109._4_4_;
                      auVar124._8_4_ = (int)auVar109._8_4_;
                      auVar124._12_4_ = (int)auVar109._12_4_;
                      auVar104 = vcvtdq2ps_avx(auVar124);
                      auVar103 = vcmpps_avx(auVar109,auVar104,1);
                      auVar103 = vandps_avx(auVar51,auVar103);
                      auVar103 = vsubps_avx(auVar104,auVar103);
                      auVar125._0_4_ = auVar103._0_4_ * 0.6931472;
                      auVar125._4_4_ = auVar103._4_4_ * 0.6931472;
                      auVar125._8_4_ = auVar103._8_4_ * 0.6931472;
                      auVar125._12_4_ = auVar103._12_4_ * 0.6931472;
                      auVar104 = vsubps_avx(auVar99,auVar125);
                      fVar42 = auVar104._0_4_;
                      fVar52 = auVar104._4_4_;
                      fVar97 = auVar104._8_4_;
                      fVar98 = auVar104._12_4_;
                      auVar110._0_4_ = (int)auVar103._0_4_;
                      auVar110._4_4_ = (int)auVar103._4_4_;
                      auVar110._8_4_ = (int)auVar103._8_4_;
                      auVar110._12_4_ = (int)auVar103._12_4_;
                      auVar103 = vpslld_avx(auVar110,0x17);
                      auVar103 = vpaddd_avx(auVar51,auVar103);
                      auVar134._0_4_ =
                           (fVar42 + 1.0 +
                           (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) *
                              fVar42 + 0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5) *
                           fVar42 * fVar42) * auVar103._0_4_ + 1.0;
                      auVar134._4_4_ =
                           (fVar52 + 1.0 +
                           (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) *
                              fVar52 + 0.041665796) * fVar52 + 0.16666666) * fVar52 + 0.5) *
                           fVar52 * fVar52) * auVar103._4_4_ + 1.0;
                      auVar134._8_4_ =
                           (fVar97 + 1.0 +
                           (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) *
                              fVar97 + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) *
                           fVar97 * fVar97) * auVar103._8_4_ + 1.0;
                      auVar134._12_4_ =
                           (fVar98 + 1.0 +
                           (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) *
                              fVar98 + 0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5) *
                           fVar98 * fVar98) * auVar103._12_4_ + 1.0;
                      auVar87._8_4_ = 0x800000;
                      auVar87._0_8_ = 0x80000000800000;
                      auVar87._12_4_ = 0x800000;
                      auVar103 = vmaxps_avx(auVar134,auVar87);
                      auVar104 = vpsrld_avx(auVar103,0x17);
                      auVar126._8_4_ = 0x807fffff;
                      auVar126._0_8_ = 0x807fffff807fffff;
                      auVar126._12_4_ = 0x807fffff;
                      auVar103 = vandps_avx(auVar103,auVar126);
                      auVar127._8_4_ = 0x3f000000;
                      auVar127._0_8_ = 0x3f0000003f000000;
                      auVar127._12_4_ = 0x3f000000;
                      auVar71 = vorps_avx(auVar103,auVar127);
                      auVar128._8_4_ = 0xffffff82;
                      auVar128._0_8_ = 0xffffff82ffffff82;
                      auVar128._12_4_ = 0xffffff82;
                      auVar103 = vpaddd_avx(auVar104,auVar128);
                      auVar99 = vcvtdq2ps_avx(auVar103);
                      auVar129._8_4_ = 0x3f3504f3;
                      auVar129._0_8_ = 0x3f3504f33f3504f3;
                      auVar129._12_4_ = 0x3f3504f3;
                      auVar104 = vcmpps_avx(auVar71,auVar129,1);
                      auVar103 = vandps_avx(auVar104,auVar71);
                      fVar42 = auVar103._0_4_ + auVar71._0_4_ + -1.0;
                      fVar52 = auVar103._4_4_ + auVar71._4_4_ + -1.0;
                      fVar97 = auVar103._8_4_ + auVar71._8_4_ + -1.0;
                      fVar98 = auVar103._12_4_ + auVar71._12_4_ + -1.0;
                      auVar103 = vandps_avx(auVar51,auVar104);
                      auVar104 = vsubps_avx(auVar99,auVar103);
                      auVar137._8_4_ = 0x42b0c0a5;
                      auVar137._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar137._12_4_ = 0x42b0c0a5;
                      auVar138 = ZEXT1664(auVar137);
                      auVar103 = vcmpps_avx(auVar134,(undefined1  [16])0x0,2);
                      auVar88._0_4_ =
                           (auVar104._0_4_ * 0.6931472 + fVar42 +
                           (((((((((fVar42 * 0.070376836 + -0.1151461) * fVar42 + 0.116769984) *
                                  fVar42 + -0.12420141) * fVar42 + 0.14249323) * fVar42 +
                               -0.16668057) * fVar42 + 0.20000714) * fVar42 + -0.24999994) * fVar42
                            + 0.3333333) * fVar42 + -0.5) * fVar42 * fVar42) * -2.0;
                      auVar88._4_4_ =
                           (auVar104._4_4_ * 0.6931472 + fVar52 +
                           (((((((((fVar52 * 0.070376836 + -0.1151461) * fVar52 + 0.116769984) *
                                  fVar52 + -0.12420141) * fVar52 + 0.14249323) * fVar52 +
                               -0.16668057) * fVar52 + 0.20000714) * fVar52 + -0.24999994) * fVar52
                            + 0.3333333) * fVar52 + -0.5) * fVar52 * fVar52) * -2.0;
                      auVar88._8_4_ =
                           (auVar104._8_4_ * 0.6931472 + fVar97 +
                           (((((((((fVar97 * 0.070376836 + -0.1151461) * fVar97 + 0.116769984) *
                                  fVar97 + -0.12420141) * fVar97 + 0.14249323) * fVar97 +
                               -0.16668057) * fVar97 + 0.20000714) * fVar97 + -0.24999994) * fVar97
                            + 0.3333333) * fVar97 + -0.5) * fVar97 * fVar97) * -2.0;
                      auVar88._12_4_ =
                           (auVar104._12_4_ * 0.6931472 + fVar98 +
                           (((((((((fVar98 * 0.070376836 + -0.1151461) * fVar98 + 0.116769984) *
                                  fVar98 + -0.12420141) * fVar98 + 0.14249323) * fVar98 +
                               -0.16668057) * fVar98 + 0.20000714) * fVar98 + -0.24999994) * fVar98
                            + 0.3333333) * fVar98 + -0.5) * fVar98 * fVar98) * -2.0;
                      auVar55._8_4_ = 0x7fffffff;
                      auVar55._0_8_ = 0x7fffffff7fffffff;
                      auVar55._12_4_ = 0x7fffffff;
                      auVar103 = vblendvps_avx(auVar88,auVar55,auVar103);
                      auVar103 = vminps_avx(auVar137,auVar103);
                      auVar99 = vmaxps_avx(auVar140,auVar103);
                      auVar141 = ZEXT1664(CONCAT412(0x80000000,
                                                    CONCAT48(0x80000000,0x8000000080000000)));
                      auVar111._0_4_ = auVar99._0_4_ * 1.442695 + 0.5;
                      auVar111._4_4_ = auVar99._4_4_ * 1.442695 + 0.5;
                      auVar111._8_4_ = auVar99._8_4_ * 1.442695 + 0.5;
                      auVar111._12_4_ = auVar99._12_4_ * 1.442695 + 0.5;
                      auVar130._0_4_ = (int)auVar111._0_4_;
                      auVar130._4_4_ = (int)auVar111._4_4_;
                      auVar130._8_4_ = (int)auVar111._8_4_;
                      auVar130._12_4_ = (int)auVar111._12_4_;
                      auVar104 = vcvtdq2ps_avx(auVar130);
                      auVar103 = vcmpps_avx(auVar111,auVar104,1);
                      auVar103 = vandps_avx(auVar51,auVar103);
                      auVar103 = vsubps_avx(auVar104,auVar103);
                      auVar131._0_4_ = auVar103._0_4_ * 0.6931472;
                      auVar131._4_4_ = auVar103._4_4_ * 0.6931472;
                      auVar131._8_4_ = auVar103._8_4_ * 0.6931472;
                      auVar131._12_4_ = auVar103._12_4_ * 0.6931472;
                      auVar104 = vsubps_avx(auVar99,auVar131);
                      fVar42 = auVar104._0_4_;
                      fVar52 = auVar104._4_4_;
                      fVar97 = auVar104._8_4_;
                      fVar98 = auVar104._12_4_;
                      auVar59 = ZEXT1664(CONCAT412(0x3f000000,
                                                   CONCAT48(0x3f000000,0x3f0000003f000000)));
                      auVar112._0_4_ = (int)auVar103._0_4_;
                      auVar112._4_4_ = (int)auVar103._4_4_;
                      auVar112._8_4_ = (int)auVar103._8_4_;
                      auVar112._12_4_ = (int)auVar103._12_4_;
                      auVar103 = vpslld_avx(auVar112,0x17);
                      auVar103 = vpaddd_avx(auVar51,auVar103);
                      auVar89._0_4_ =
                           (fVar42 + 1.0 +
                           (((((fVar42 * 0.00019875691 + 0.0013981999) * fVar42 + 0.008333452) *
                              fVar42 + 0.041665796) * fVar42 + 0.16666666) * fVar42 + 0.5) *
                           fVar42 * fVar42) * auVar103._0_4_ + 1.0;
                      auVar89._4_4_ =
                           (fVar52 + 1.0 +
                           (((((fVar52 * 0.00019875691 + 0.0013981999) * fVar52 + 0.008333452) *
                              fVar52 + 0.041665796) * fVar52 + 0.16666666) * fVar52 + 0.5) *
                           fVar52 * fVar52) * auVar103._4_4_ + 1.0;
                      auVar89._8_4_ =
                           (fVar97 + 1.0 +
                           (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) *
                              fVar97 + 0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5) *
                           fVar97 * fVar97) * auVar103._8_4_ + 1.0;
                      auVar89._12_4_ =
                           (fVar98 + 1.0 +
                           (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) *
                              fVar98 + 0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5) *
                           fVar98 * fVar98) * auVar103._12_4_ + 1.0;
                      auVar103 = vrcpps_avx(auVar89);
                      fVar42 = auVar103._0_4_;
                      fVar52 = auVar103._4_4_;
                      fVar97 = auVar103._8_4_;
                      fVar98 = auVar103._12_4_;
                      auVar90._0_4_ = auVar89._0_4_ * (fVar42 + fVar42);
                      auVar90._4_4_ = auVar89._4_4_ * (fVar52 + fVar52);
                      auVar90._8_4_ = auVar89._8_4_ * (fVar97 + fVar97);
                      auVar90._12_4_ = auVar89._12_4_ * (fVar98 + fVar98);
                      auVar135._8_4_ = 0x40000000;
                      auVar135._0_8_ = 0x4000000040000000;
                      auVar135._12_4_ = 0x40000000;
                      auVar103 = vsubps_avx(auVar135,auVar90);
                      auVar91._0_4_ = fVar42 + fVar42 + -1.0 + fVar42 * auVar103._0_4_;
                      auVar91._4_4_ = fVar52 + fVar52 + -1.0 + fVar52 * auVar103._4_4_;
                      auVar91._8_4_ = fVar97 + fVar97 + -1.0 + fVar97 * auVar103._8_4_;
                      auVar91._12_4_ = fVar98 + fVar98 + -1.0 + fVar98 * auVar103._12_4_;
                      goto LAB_004151f0;
                    case 5:
                      fVar42 = **(float **)(&this->field_0x118 + (long)p_Var41);
                      fVar52 = (*(float **)(&this->field_0x118 + (long)p_Var41))[1];
                      auVar96._0_4_ = fVar42 * fVar60 + fVar52;
                      auVar96._4_4_ = fVar42 * fVar68 + fVar52;
                      auVar96._8_4_ = fVar42 * fVar69 + fVar52;
                      auVar96._12_4_ = fVar42 * fVar70 + fVar52;
                      auVar103 = vmaxps_avx(auVar96,(undefined1  [16])0x0);
                      auVar91 = vminps_avx(auVar51,auVar103);
LAB_004151f0:
                      auVar71._0_4_ = auVar91._0_4_ * fVar60;
                      auVar71._4_4_ = auVar91._4_4_ * fVar68;
                      auVar71._8_4_ = auVar91._8_4_ * fVar69;
                      auVar71._12_4_ = auVar91._12_4_ * fVar70;
                    }
                    if (iVar46 < 0x65) {
                      *pauVar47 = auVar61;
                      pauVar47[1] = auVar71;
                      pauVar47 = pauVar47 + 2;
                    }
                    else {
                      pfVar35 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var41) +
                                         local_298 * 0x20);
                      auVar65._0_4_ = auVar61._0_4_ * *pfVar35;
                      auVar65._4_4_ = auVar61._4_4_ * pfVar35[1];
                      auVar65._8_4_ = auVar61._8_4_ * pfVar35[2];
                      auVar65._12_4_ = auVar61._12_4_ * pfVar35[3];
                      pfVar35 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var41) + 0x10 +
                                         local_298 * 0x20);
                      auVar75._0_4_ = auVar71._0_4_ * *pfVar35;
                      auVar75._4_4_ = auVar71._4_4_ * pfVar35[1];
                      auVar75._8_4_ = auVar71._8_4_ * pfVar35[2];
                      auVar75._12_4_ = auVar71._12_4_ * pfVar35[3];
                      auVar103 = vandps_avx(auVar141._0_16_,auVar65);
                      auVar104 = vandps_avx(auVar141._0_16_,auVar75);
                      auVar103 = vorps_avx(auVar103,auVar59._0_16_);
                      auVar104 = vorps_avx(auVar104,auVar59._0_16_);
                      auVar66._0_4_ = (int)(auVar65._0_4_ + auVar103._0_4_);
                      auVar66._4_4_ = (int)(auVar65._4_4_ + auVar103._4_4_);
                      auVar66._8_4_ = (int)(auVar65._8_4_ + auVar103._8_4_);
                      auVar66._12_4_ = (int)(auVar65._12_4_ + auVar103._12_4_);
                      auVar76._0_4_ = (int)(auVar75._0_4_ + auVar104._0_4_);
                      auVar76._4_4_ = (int)(auVar75._4_4_ + auVar104._4_4_);
                      auVar76._8_4_ = (int)(auVar75._8_4_ + auVar104._8_4_);
                      auVar76._12_4_ = (int)(auVar75._12_4_ + auVar104._12_4_);
                      auVar103 = vpackssdw_avx(auVar66,auVar76);
                      auVar103 = vpminsw_avx(auVar103,_DAT_0059f660);
                      auVar103 = vpmaxsw_avx(auVar103,_DAT_0059f670);
                      auVar103 = vpacksswb_avx(auVar103,auVar103);
                      *(long *)*pauVar48 = auVar103._0_8_;
                      pauVar48 = (undefined1 (*) [16])((long)*pauVar48 + 8);
                    }
                    bVar50 = iVar39 != iVar34;
                    iVar39 = iVar39 + 1;
                  } while (bVar50);
                }
                uVar38 = (int)local_2b0 + 1;
                bVar50 = (int)local_2b0 != (int)local_1d8;
                local_2b0 = (ulong)uVar38;
              } while (bVar50);
            }
            local_298 = local_298 + 1;
            local_290 = (ulong)(uint)((int)local_290 + iVar45);
            local_1e0 = uVar37;
          } while (local_298 != uVar37);
        }
        if ((pointer)local_308._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_308._0_8_,local_308._16_8_ - local_308._0_8_);
        }
        iVar40 = 0;
        local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_);
      }
      goto LAB_004163e2;
    }
    p_Var41 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
    iVar45 = *(int *)(&this->field_0xd4 + (long)p_Var41);
    if ((long)iVar45 == 3) {
      if (((((*(int *)(&this->field_0xd8 + (long)p_Var41) == 3) &&
            (*(int *)(&this->field_0xe4 + (long)p_Var41) == 1)) &&
           (*(int *)(&this->field_0xe8 + (long)p_Var41) == 1)) &&
          ((*(int *)(&this->field_0xdc + (long)p_Var41) == 1 &&
           (*(int *)(&this->field_0xe0 + (long)p_Var41) == 1)))) &&
         (*(uint *)(&this->field_0x110 + (long)p_Var41) < 2)) {
        if (iVar46 < 0x65) {
          local_308._0_8_ = (pointer)0x0;
          local_308._8_8_ = (Allocator *)0x0;
          local_308._16_8_ = (Allocator *)0x0;
          p_Var41 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var41)) {
            lVar32 = 0;
            local_308._8_8_ = (float *)0x0;
            do {
              local_238._0_4_ =
                   1.0 / (*(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var41) + lVar32 * 4) *
                         *(float *)(*(long *)(&this->field_0x240 + (long)p_Var41) + lVar32 * 4));
              if (local_308._8_8_ == local_308._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)local_238);
              }
              else {
                *(undefined4 *)local_308._8_8_ = local_238._0_4_;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              lVar32 = lVar32 + 1;
              p_Var41 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
            } while (lVar32 < *(int *)(&this->field_0x108 + (long)p_Var41));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_a8,(vector<float,_std::allocator<float>_> *)local_308);
          convdw3x3s1_int8_dequant_sse
                    (&local_288,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var41),&local_a8,opt_00);
        }
        else {
          local_308._0_8_ = (pointer)0x0;
          local_308._8_8_ = (Allocator *)0x0;
          local_308._16_8_ = (Allocator *)0x0;
          p_Var41 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var41)) {
            lVar32 = 0;
            local_308._8_8_ = (float *)0x0;
            do {
              fVar42 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var41) + lVar32 * 4);
              local_238._0_4_ = 0.0;
              if (fVar42 != 0.0) {
                local_238._0_4_ =
                     1.0 / (fVar42 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var41) +
                                               lVar32 * 4));
              }
              local_178._0_4_ =
                   *(float *)(*(long *)(&this->field_0x288 + (long)p_Var41) + lVar32 * 4);
              if (local_308._8_8_ == local_308._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)local_238);
              }
              else {
                *(undefined4 *)local_308._8_8_ = local_238._0_4_;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              if (local_308._8_8_ == local_308._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)&local_178);
              }
              else {
                *(float *)local_308._8_8_ = (float)local_178;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              lVar32 = lVar32 + 1;
              p_Var41 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
            } while (lVar32 < *(int *)(&this->field_0x108 + (long)p_Var41));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_90,(vector<float,_std::allocator<float>_> *)local_308);
          convdw3x3s1_int8_requant_sse
                    (&local_288,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var41),&local_90,opt_00);
          local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        if (local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_308._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_308._0_8_,local_308._16_8_ - local_308._0_8_);
        }
        pLVar6 = this->activation;
      }
      else {
        if ((((iVar45 != 3) || (*(int *)(&this->field_0xd8 + (long)p_Var41) != 3)) ||
            ((*(int *)(&this->field_0xdc + (long)p_Var41) != 1 ||
             (((*(int *)(&this->field_0xe0 + (long)p_Var41) != 1 ||
               (*(int *)(&this->field_0xe4 + (long)p_Var41) != 2)) ||
              (*(int *)(&this->field_0xe8 + (long)p_Var41) != 2)))))) ||
           (1 < *(uint *)(&this->field_0x110 + (long)p_Var41))) goto LAB_00415d76;
        if (iVar46 < 0x65) {
          local_308._0_8_ = (pointer)0x0;
          local_308._8_8_ = (Allocator *)0x0;
          local_308._16_8_ = (Allocator *)0x0;
          p_Var41 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var41)) {
            lVar32 = 0;
            local_308._8_8_ = (float *)0x0;
            do {
              local_238._0_4_ =
                   1.0 / (*(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var41) + lVar32 * 4) *
                         *(float *)(*(long *)(&this->field_0x240 + (long)p_Var41) + lVar32 * 4));
              if (local_308._8_8_ == local_308._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)local_238);
              }
              else {
                *(undefined4 *)local_308._8_8_ = local_238._0_4_;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              lVar32 = lVar32 + 1;
              p_Var41 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
            } while (lVar32 < *(int *)(&this->field_0x108 + (long)p_Var41));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_d8,(vector<float,_std::allocator<float>_> *)local_308);
          convdw3x3s2_int8_dequant_sse
                    (&local_288,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var41),&local_d8,opt_00);
        }
        else {
          local_308._0_8_ = (pointer)0x0;
          local_308._8_8_ = (Allocator *)0x0;
          local_308._16_8_ = (Allocator *)0x0;
          p_Var41 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
          if (0 < *(int *)(&this->field_0x108 + (long)p_Var41)) {
            lVar32 = 0;
            local_308._8_8_ = (float *)0x0;
            do {
              fVar42 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var41) + lVar32 * 4);
              local_238._0_4_ = 0.0;
              if (fVar42 != 0.0) {
                local_238._0_4_ =
                     1.0 / (fVar42 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var41) +
                                               lVar32 * 4));
              }
              local_178._0_4_ =
                   *(float *)(*(long *)(&this->field_0x288 + (long)p_Var41) + lVar32 * 4);
              if (local_308._8_8_ == local_308._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)local_238);
              }
              else {
                *(undefined4 *)local_308._8_8_ = local_238._0_4_;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              if (local_308._8_8_ == local_308._16_8_) {
                std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                          ((vector<float,std::allocator<float>> *)local_308,
                           (iterator)local_308._8_8_,(float *)&local_178);
              }
              else {
                *(float *)local_308._8_8_ = (float)local_178;
                local_308._8_8_ = local_308._8_8_ + 4;
              }
              lVar32 = lVar32 + 1;
              p_Var41 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
            } while (lVar32 < *(int *)(&this->field_0x108 + (long)p_Var41));
          }
          std::vector<float,_std::allocator<float>_>::vector
                    (&local_c0,(vector<float,_std::allocator<float>_> *)local_308);
          convdw3x3s2_int8_requant_sse
                    (&local_288,top_blob,&this->weight_data_tm,
                     (Mat *)(&this->field_0x1b0 + (long)p_Var41),&local_c0,opt_00);
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start = local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage =
               local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
        }
        if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_308._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_308._0_8_,local_308._16_8_ - local_308._0_8_);
        }
        pLVar6 = this->activation;
      }
      if (pLVar6 != (Layer *)0x0) {
        (*pLVar6->_vptr_Layer[9])(pLVar6,top_blob,opt);
        iVar40 = 0;
        goto LAB_004163e2;
      }
    }
    else {
LAB_00415d76:
      local_298 = (long)*(int *)(&this->field_0xd8 + (long)p_Var41) * (long)iVar45;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_308,local_298,
                 (allocator_type *)local_238);
      uVar15 = local_308._0_8_;
      pp_Var3 = this->_vptr_ConvolutionDepthWise_x86_avx;
      p_Var41 = pp_Var3[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var41)) {
        iVar45 = *(int *)(&this->field_0xe0 + (long)p_Var41);
        iVar39 = *(int *)(&this->field_0xdc + (long)p_Var41);
        iVar33 = *(int *)(&this->field_0xd4 + (long)p_Var41);
        iVar29 = 0;
        fVar42 = 0.0;
        iVar40 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var3[-3])) {
            lVar32 = 0;
            do {
              *(float *)(local_308._0_8_ + (iVar40 + lVar32) * 4) = fVar42;
              fVar42 = (float)((int)fVar42 + *(int *)(&this->field_0xdc + (long)pp_Var3[-3]));
              lVar32 = lVar32 + 1;
            } while ((int)lVar32 < *(int *)(&this->field_0xd4 + (long)pp_Var3[-3]));
            iVar40 = iVar40 + (int)lVar32;
          }
          fVar42 = (float)((int)fVar42 + (iVar25 * iVar45 - iVar39 * iVar33));
          iVar29 = iVar29 + 1;
        } while (iVar29 < *(int *)(&this->field_0xd8 + (long)pp_Var3[-3]));
      }
      local_1d0 = this->_vptr_ConvolutionDepthWise_x86_avx;
      if (0 < *(int *)(&this->field_0x108 + (long)local_1d0[-3])) {
        local_e0 = (long)(int)local_298;
        uVar37 = local_298 & 0xffffffff;
        local_1e8 = 0;
        auVar59 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
        lVar32 = 0;
        uVar36 = local_298;
        do {
          lVar26 = local_1e8;
          pvVar4 = local_288.data;
          if (-1 < (int)local_1d8) {
            lVar44 = local_288.cstep * lVar32 * local_288.elemsize;
            local_2b8 = (float *)(top_blob->elemsize * lVar32 * top_blob->cstep +
                                 (long)top_blob->data);
            local_2a0 = this->_vptr_ConvolutionDepthWise_x86_avx;
            uVar49 = (long)local_288.w * local_288.elemsize;
            pvVar5 = (this->weight_data_tm).data;
            local_1e0 = 0;
            local_2a8 = local_2b8;
            local_290 = uVar49;
            do {
              if (-1 < iVar34) {
                local_2b0 = (ulong)(int)local_1e0;
                iVar45 = 0;
                do {
                  p_Var41 = local_2a0[-3];
                  fVar42 = 0.0;
                  fVar52 = 0.0;
                  if (0 < (int)uVar36) {
                    uVar31 = 0;
                    iVar39 = 0;
                    do {
                      iVar39 = iVar39 + (int)*(char *)((long)pvVar5 + uVar31 + lVar26) *
                                        (int)*(char *)((long)pvVar4 +
                                                      (long)(int)*(pointer)(uVar15 + uVar31 * 4) +
                                                      (long)*(int *)(&this->field_0xe8 +
                                                                    (long)p_Var41) * local_2b0 *
                                                      uVar49 + (long)iVar45 *
                                                               (long)*(int *)(&this->field_0xe4 +
                                                                             (long)p_Var41) + lVar44
                                                      );
                      uVar31 = uVar31 + 1;
                    } while (uVar37 != uVar31);
                    fVar52 = (float)iVar39;
                  }
                  fVar97 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var41) + lVar32 * 4);
                  if (fVar97 != 0.0) {
                    fVar42 = 1.0 / (fVar97 * *(float *)(*(long *)(&this->field_0x240 + (long)p_Var41
                                                                 ) + lVar32 * 4));
                  }
                  fVar42 = fVar42 * fVar52;
                  if (*(int *)(&this->field_0x100 + (long)p_Var41) != 0) {
                    fVar42 = fVar42 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var41) +
                                                lVar32 * 4);
                  }
                  auVar51 = ZEXT416((uint)fVar42);
                  fVar52 = fVar42;
                  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var41)) {
                  case 1:
                    auVar51 = vmaxss_avx(auVar51,ZEXT416(0));
                    fVar52 = auVar51._0_4_;
                    break;
                  case 2:
                    auVar51 = vcmpss_avx(ZEXT816(0) << 0x40,auVar51,1);
                    auVar57._8_4_ = 0x3f800000;
                    auVar57._0_8_ = 0x3f8000003f800000;
                    auVar57._12_4_ = 0x3f800000;
                    auVar51 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var41))
                                            ,auVar57,auVar51);
                    fVar98 = auVar51._0_4_;
LAB_00416113:
                    fVar52 = fVar98 * fVar42;
                    break;
                  case 3:
                    fVar42 = (float)(*(uint **)(&this->field_0x118 + (long)p_Var41))[1];
                    auVar51 = vmaxss_avx(auVar51,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                    (long)p_Var41)));
                    fVar52 = auVar51._0_4_;
                    if (fVar42 < auVar51._0_4_) {
                      fVar52 = fVar42;
                    }
                    break;
                  case 4:
                    auVar51 = vminss_avx(auVar51,ZEXT416(0x42b0c0a5));
                    auVar53._0_4_ = auVar51._0_4_ ^ auVar59._0_4_;
                    auVar53._4_4_ = auVar51._4_4_ ^ auVar59._4_4_;
                    auVar53._8_4_ = auVar51._8_4_ ^ auVar59._8_4_;
                    auVar53._12_4_ = auVar51._12_4_ ^ auVar59._12_4_;
                    auVar51 = vcmpss_avx(auVar51,ZEXT416(0xc2b0c0a5),1);
                    auVar56._8_4_ = 0x42b0c0a5;
                    auVar56._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar56._12_4_ = 0x42b0c0a5;
                    auVar51 = vblendvps_avx(auVar53,auVar56,auVar51);
                    fVar42 = expf(auVar51._0_4_);
                    auVar59 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000))
                                      );
                    uVar36 = local_298;
                    uVar49 = local_290;
                    fVar52 = 1.0 / (fVar42 + 1.0);
                    break;
                  case 5:
                    fVar52 = expf(fVar42);
                    fVar52 = logf(fVar52 + 1.0);
                    fVar52 = tanhf(fVar52);
                    auVar59 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000))
                                      );
                    uVar36 = local_298;
                    uVar49 = local_290;
                    fVar52 = fVar52 * fVar42;
                    break;
                  case 6:
                    fVar97 = **(float **)(&this->field_0x118 + (long)p_Var41);
                    fVar98 = (*(float **)(&this->field_0x118 + (long)p_Var41))[1];
                    fVar60 = (float)((uint)fVar98 ^ auVar59._0_4_) / fVar97;
                    fVar52 = 0.0;
                    if ((fVar60 <= fVar42) && (fVar52 = fVar42, fVar42 <= fVar60 + 1.0 / fVar97)) {
                      fVar98 = fVar97 * fVar42 + fVar98;
                      goto LAB_00416113;
                    }
                  }
                  if (iVar46 < 0x65) {
                    *local_2b8 = fVar52;
                    local_2b8 = local_2b8 + 1;
                  }
                  else {
                    fVar52 = fVar52 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var41) +
                                                lVar32 * 4);
                    auVar51 = vandps_avx(ZEXT416((uint)fVar52),auVar59._0_16_);
                    auVar58._8_4_ = 0x3effffff;
                    auVar58._0_8_ = 0x3effffff3effffff;
                    auVar58._12_4_ = 0x3effffff;
                    auVar51 = vorps_avx(auVar51,auVar58);
                    auVar51 = ZEXT416((uint)(fVar52 + auVar51._0_4_));
                    auVar51 = vroundss_avx(auVar51,auVar51,0xb);
                    iVar39 = (int)auVar51._0_4_;
                    if (iVar39 < -0x7e) {
                      iVar39 = -0x7f;
                    }
                    uVar27 = (undefined1)iVar39;
                    if (0x7e < iVar39) {
                      uVar27 = 0x7f;
                    }
                    *(undefined1 *)local_2a8 = uVar27;
                    local_2a8 = (float *)((long)local_2a8 + 1);
                  }
                  bVar50 = iVar45 != iVar34;
                  iVar45 = iVar45 + 1;
                } while (bVar50);
              }
              iVar45 = (int)local_1e0;
              local_1e0 = (ulong)(iVar45 + 1);
            } while (iVar45 != (int)local_1d8);
          }
          lVar32 = lVar32 + 1;
          local_1e8 = local_1e8 + local_e0;
        } while (lVar32 < *(int *)(&this->field_0x108 + (long)local_1d0[-3]));
      }
      if ((pointer)local_308._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_308._0_8_,local_308._16_8_ - local_308._0_8_);
      }
    }
    iVar40 = 0;
    goto LAB_004163e2;
  }
  iVar34 = *(int *)(&this->field_0x10c + (long)p_Var41);
  local_2a8 = (float *)0x1;
  if (opt->use_packing_layout == true) {
    if (iVar34 < 0x65) {
      local_2a8 = (float *)(ulong)((uint)((*(uint *)(&this->field_0xd0 + (long)p_Var41) & 3) == 0) *
                                   3 + 1);
    }
    else {
      local_2a8 = (float *)0x1;
      if ((*(uint *)(&this->field_0xd0 + (long)p_Var41) & 7) == 0) {
        local_2a8 = (float *)&DAT_00000008;
      }
    }
  }
  iVar46 = (int)local_2a8;
  pfVar35 = (float *)(ulong)(uint)(iVar46 * 4);
  if (100 < iVar34) {
    pfVar35 = local_2a8;
  }
  local_2a0 = (_func_int **)CONCAT44(local_2a0._4_4_,iVar39);
  local_2b0 = CONCAT44(local_2b0._4_4_,iVar45);
  Mat::create(top_blob,iVar39,iVar45,*(int *)(&this->field_0xd0 + (long)p_Var41) / iVar46,
              (size_t)pfVar35,iVar46,opt->blob_allocator);
  auVar24 = local_2e8;
  iVar40 = -100;
  local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_);
  if ((top_blob->data == (void *)0x0) ||
     (local_308._8_8_ = (Allocator *)CONCAT44(local_308._12_4_,local_308._8_4_),
     (long)top_blob->c * top_blob->cstep == 0)) goto LAB_004163e2;
  uVar38 = (int)uVar38 /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
  uVar28 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
  local_2b8 = (float *)CONCAT44(local_2b8._4_4_,uVar28);
  iVar45 = 1;
  _elempack = 1;
  if (opt->use_packing_layout == true) {
    iVar45 = 1;
    if ((uVar38 & 7) == 0) {
      iVar45 = 8;
    }
    if (iVar34 < 0x65) {
      _elempack = (uint)((uVar28 & 3) == 0) * 3 + 1;
    }
    else {
      _elempack = 1;
      if ((uVar28 & 7) == 0) {
        _elempack = 8;
      }
    }
  }
  piVar2 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
  local_308._0_8_ = local_288.data;
  local_308._8_4_ = local_288.refcount._0_4_;
  local_308._12_4_ = local_288.refcount._4_4_;
  local_308._16_8_ = local_288.elemsize;
  local_308._24_4_ = local_288.elempack;
  local_2e8._12_4_ = local_288.w;
  local_2e8._8_4_ = local_288.dims;
  local_2e8._20_4_ = local_288.d;
  local_2e8._16_4_ = local_288.h;
  local_2e8._0_8_ = local_288.allocator;
  local_2e8._28_4_ = auVar24._28_4_;
  local_2e8._24_4_ = local_288.c;
  local_2c8 = local_288.cstep;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  if (iVar45 < iVar33) {
    uVar15._0_1_ = opt->lightmode;
    uVar15._1_3_ = *(undefined3 *)&opt->field_0x1;
    uVar15._4_4_ = opt->num_threads;
    local_238._16_8_ = opt->workspace_allocator;
    uVar16 = opt->openmp_blocktime;
    uVar17 = opt->use_winograd_convolution;
    uVar19 = opt->use_sgemm_convolution;
    uVar21 = opt->use_int8_inference;
    uVar23 = opt->use_vulkan_compute;
    uVar22 = CONCAT11(uVar23,uVar21);
    uVar20 = CONCAT21(uVar22,uVar19);
    uVar18 = CONCAT31(uVar20,uVar17);
    local_238._32_8_ = *(undefined8 *)&opt->use_bf16_storage;
    auStack_210[0] = opt->use_shader_pack8;
    auStack_210[1] = opt->use_subgroup_basic;
    auStack_210[2] = opt->use_subgroup_vote;
    auStack_210[3] = opt->use_subgroup_ballot;
    auStack_210[4] = opt->use_subgroup_shuffle;
    auStack_210[5] = opt->use_image_storage;
    auStack_210[6] = opt->use_tensor_storage;
    auStack_210[7] = opt->use_reserved_0;
    auStack_210._8_4_ = opt->flush_denormals;
    auStack_210[0xc] = opt->use_local_pool_allocator;
    auStack_210[0xd] = opt->use_shader_local_memory;
    auStack_210[0xe] = opt->use_cooperative_matrix;
    auStack_210[0xf] = opt->use_winograd23_convolution;
    uStack_200._0_1_ = opt->use_winograd43_convolution;
    uStack_200._1_1_ = opt->use_winograd63_convolution;
    uStack_200._2_1_ = opt->use_a53_a55_optimized_kernel;
    uStack_200._3_1_ = opt->use_reserved_7;
    uStack_200._4_1_ = opt->use_reserved_8;
    uStack_200._5_1_ = opt->use_reserved_9;
    uStack_200._6_1_ = opt->use_reserved_10;
    uStack_200._7_1_ = opt->use_reserved_11;
    local_238._0_4_ = (undefined4)uVar15;
    local_238._8_4_ = SUB84(opt->workspace_allocator,0);
    local_238._12_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    local_238._4_4_ = uVar15._4_4_;
    local_238._24_4_ = uVar16;
    local_238._28_4_ = uVar18;
    convert_packing(&local_288,(Mat *)local_308,iVar45,(Option *)local_238);
  }
  piVar2 = top_blob->refcount;
  local_238._0_4_ = SUB84(top_blob->data,0);
  local_238._4_4_ = (undefined4)((ulong)top_blob->data >> 0x20);
  local_238._8_4_ = SUB84(top_blob->refcount,0);
  local_238._12_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
  local_238._16_8_ = top_blob->elemsize;
  local_238._24_4_ = top_blob->elempack;
  local_238._32_8_ = top_blob->allocator;
  auStack_210._0_4_ = top_blob->dims;
  auStack_210._4_4_ = top_blob->w;
  auStack_210._8_4_ = top_blob->h;
  auStack_210._12_4_ = top_blob->d;
  uStack_200 = CONCAT44(uStack_200._4_4_,top_blob->c);
  local_1f8 = top_blob->cstep;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
  }
  if (_elempack < (uint)local_2a8) {
    Mat::create((Mat *)local_238,(int)local_2a0,(int)local_2b0,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) /
                (int)_elempack,
                (ulong)((int)((ulong)pfVar35 / ((ulong)local_2a8 & 0xffffffff)) * _elempack),
                _elempack,opt->workspace_allocator);
    iVar40 = -100;
    if ((CONCAT44(local_238._4_4_,local_238._0_4_) != 0) && ((long)(int)uStack_200 * local_1f8 != 0)
       ) goto LAB_004157f4;
  }
  else {
LAB_004157f4:
    if (0 < *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3])) {
      local_2a0 = (_func_int **)CONCAT44(local_2a0._4_4_,(int)uVar38 / iVar45);
      iVar39 = (int)local_2b8 / (int)_elempack;
      iVar46 = 0;
      iVar34 = 0;
      lVar32 = 0;
      do {
        local_178 = (pointer)((long)(iVar46 / iVar45) * local_2c8 * local_308._16_8_ +
                             local_308._0_8_);
        uStack_170 = 0;
        uStack_16c = 0;
        local_168 = (Allocator *)local_308._16_8_;
        local_160 = local_308._24_4_;
        local_158 = (Allocator *)local_2e8._0_8_;
        local_140 = (int)local_2a0;
        local_138 = ((long)(int)local_2e8._20_4_ * local_308._16_8_ *
                     (long)(int)local_2e8._16_4_ * (long)(int)local_2e8._12_4_ + 0xfU &
                    0xfffffffffffffff0) / (ulong)local_308._16_8_;
        local_150 = local_2e8._8_16_;
        local_128 = (void *)((long)(iVar34 / (int)_elempack) * local_1f8 * local_238._16_8_ +
                            CONCAT44(local_238._4_4_,local_238._0_4_));
        uStack_120 = 0;
        uStack_11c = 0;
        local_118 = (Allocator *)local_238._16_8_;
        local_110 = local_238._24_4_;
        local_108 = (Allocator *)local_238._32_8_;
        local_e8 = ((long)(int)auStack_210._12_4_ * local_238._16_8_ *
                    (long)(int)auStack_210._8_4_ * (long)(int)auStack_210._4_4_ + 0xfU &
                   0xfffffffffffffff0) / (ulong)local_238._16_8_;
        local_100 = auStack_210;
        pLVar6 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar32];
        local_78._0_1_ = opt->lightmode;
        local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
        local_78._4_4_ = opt->num_threads;
        pAStack_68 = opt->workspace_allocator;
        uStack_60._0_4_ = opt->openmp_blocktime;
        uStack_60._4_1_ = opt->use_winograd_convolution;
        uStack_60._5_1_ = opt->use_sgemm_convolution;
        uStack_60._6_1_ = opt->use_int8_inference;
        uStack_60._7_1_ = opt->use_vulkan_compute;
        local_58._0_1_ = opt->use_bf16_storage;
        local_58._1_1_ = opt->use_fp16_packed;
        local_58._2_1_ = opt->use_fp16_storage;
        local_58._3_1_ = opt->use_fp16_arithmetic;
        local_58._4_1_ = opt->use_int8_packed;
        local_58._5_1_ = opt->use_int8_storage;
        local_58._6_1_ = opt->use_int8_arithmetic;
        local_58._7_1_ = opt->use_packing_layout;
        uStack_50._0_1_ = opt->use_shader_pack8;
        uStack_50._1_1_ = opt->use_subgroup_basic;
        uStack_50._2_1_ = opt->use_subgroup_vote;
        uStack_50._3_1_ = opt->use_subgroup_ballot;
        uStack_50._4_1_ = opt->use_subgroup_shuffle;
        uStack_50._5_1_ = opt->use_image_storage;
        uStack_50._6_1_ = opt->use_tensor_storage;
        uStack_50._7_1_ = opt->use_reserved_0;
        uStack_48._0_4_ = opt->flush_denormals;
        uStack_48._4_1_ = opt->use_local_pool_allocator;
        uStack_48._5_1_ = opt->use_shader_local_memory;
        uStack_48._6_1_ = opt->use_cooperative_matrix;
        uStack_48._7_1_ = opt->use_winograd23_convolution;
        uStack_40._0_1_ = opt->use_winograd43_convolution;
        uStack_40._1_1_ = opt->use_winograd63_convolution;
        uStack_40._2_1_ = opt->use_a53_a55_optimized_kernel;
        uStack_40._3_1_ = opt->use_reserved_7;
        uStack_40._4_1_ = opt->use_reserved_8;
        uStack_40._5_1_ = opt->use_reserved_9;
        uStack_40._6_1_ = opt->use_reserved_10;
        uStack_40._7_1_ = opt->use_reserved_11;
        pAStack_70 = (Allocator *)local_238._32_8_;
        local_f0 = iVar39;
        (*pLVar6->_vptr_Layer[7])(pLVar6,&local_178,&local_128);
        piVar2 = (int *)CONCAT44(uStack_11c,uStack_120);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (local_108 == (Allocator *)0x0) {
              if (local_128 != (void *)0x0) {
                free(local_128);
              }
            }
            else {
              (*local_108->_vptr_Allocator[3])();
            }
          }
        }
        local_e8 = 0;
        local_128 = (void *)0x0;
        uStack_120 = 0;
        uStack_11c = 0;
        local_118 = (Allocator *)0x0;
        local_110 = 0;
        local_100 = (undefined1  [16])0x0;
        local_f0 = 0;
        piVar2 = (int *)CONCAT44(uStack_16c,uStack_170);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (local_158 == (Allocator *)0x0) {
              if (local_178 != (pointer)0x0) {
                free(local_178);
              }
            }
            else {
              (*local_158->_vptr_Allocator[3])();
            }
          }
        }
        local_138 = 0;
        local_178._0_4_ = 0.0;
        local_178._4_4_ = 0;
        uStack_170 = 0;
        uStack_16c = 0;
        local_168 = (Allocator *)0x0;
        local_160 = 0;
        local_150 = (undefined1  [16])0x0;
        local_140 = 0;
        lVar32 = lVar32 + 1;
        iVar34 = iVar34 + (int)local_2b8;
        iVar46 = iVar46 + uVar38;
      } while (lVar32 < *(int *)(&this->field_0x108 +
                                (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
    }
    if (_elempack < (uint)local_2a8) {
      convert_packing((Mat *)local_238,top_blob,(uint)local_2a8,opt);
      iVar40 = 0;
    }
    else {
      iVar40 = 0;
      if ((Mat *)local_238 != top_blob) {
        piVar2 = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = top_blob->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        auVar51 = auStack_210;
        iVar40 = 0;
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = (void *)CONCAT44(local_238._4_4_,local_238._0_4_);
        top_blob->refcount = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
        top_blob->elemsize = local_238._16_8_;
        top_blob->elempack = local_238._24_4_;
        top_blob->allocator = (Allocator *)local_238._32_8_;
        top_blob->dims = auStack_210._0_4_;
        top_blob->w = auStack_210._4_4_;
        top_blob->h = auStack_210._8_4_;
        top_blob->d = auStack_210._12_4_;
        top_blob->c = (int)uStack_200;
        top_blob->cstep = local_1f8;
        auStack_210 = auVar51;
      }
    }
  }
  piVar2 = (int *)CONCAT44(local_238._12_4_,local_238._8_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if ((Allocator *)local_238._32_8_ == (Allocator *)0x0) {
        if ((void *)CONCAT44(local_238._4_4_,local_238._0_4_) != (void *)0x0) {
          free((void *)CONCAT44(local_238._4_4_,local_238._0_4_));
        }
      }
      else {
        (*(*(_func_int ***)local_238._32_8_)[3])();
      }
    }
  }
  local_1f8 = 0;
  local_238._0_4_ = 0.0;
  local_238._4_4_ = 0;
  local_238._8_4_ = 0;
  local_238._12_4_ = 0;
  local_238._16_8_ = (Allocator *)0x0;
  local_238._24_4_ = 0;
  auStack_210 = (undefined1  [16])0x0;
  uStack_200 = uStack_200 & 0xffffffff00000000;
  piVar2 = (int *)CONCAT44(local_308._12_4_,local_308._8_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if ((Allocator *)local_2e8._0_8_ == (Allocator *)0x0) {
        if ((pointer)local_308._0_8_ != (pointer)0x0) {
          free((void *)local_308._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_2e8._0_8_)[3])();
      }
    }
  }
  local_2c8 = 0;
  local_308._0_8_ = (pointer)0x0;
  local_308._8_8_ = (Allocator *)0x0;
  local_308._16_8_ = (Allocator *)0x0;
  local_308._24_4_ = 0;
  local_2e8._0_28_ = ZEXT828((ulong)local_2e8._0_8_);
LAB_004163e2:
  piVar2 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if (local_288.allocator == (Allocator *)0x0) {
        if ((pointer)local_288.data != (pointer)0x0) {
          free(local_288.data);
        }
      }
      else {
        (*(local_288.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_288.cstep = 0;
  local_288.data = (void *)0x0;
  local_288.refcount._0_4_ = 0;
  local_288.refcount._4_4_ = 0;
  local_288.elemsize = 0;
  local_288.elempack = 0;
  local_288.dims = 0;
  local_288.w = 0;
  local_288.h = 0;
  local_288.d = 0;
  local_288.c = 0;
  piVar2 = (int *)CONCAT44(local_1c8._12_4_,local_1c8._8_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      if ((Allocator *)local_1c8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_1c8._0_8_ != (void *)0x0) {
          free((void *)local_1c8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_1c8._32_8_)[3])();
      }
    }
  }
  return iVar40;
}

Assistant:

int ConvolutionDepthWise_x86_avx::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}